

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_tvptr(ASMState *as,Reg dest,IRRef ref,MSize mode)

{
  IRIns *ir;
  MCode *pMVar1;
  Reg RVar2;
  uint uVar3;
  int i;
  x86Op xo;
  TValue k;
  
  if ((mode & 1) != 0) {
    ir = as->ir + ref;
    if (((ir->field_1).t.irt & 0x1f) == 0xe) {
      if (ref < 0x8000 && (mode & 2) == 0) {
        emit_loadu64(as,dest,(uint64_t)(ir + 1));
        return;
      }
      RVar2 = ra_alloc1(as,ref,0xffff0000);
      xo = XO_MOVSDto;
    }
    else {
      if (ref < 0x8000) {
        lj_ir_kvalue(as->J->L,&k,ir);
        emit_movmroi(as,dest,4,k.field_4.it);
        emit_movmroi(as,dest,0,k.field_4.i);
        goto LAB_0013f0e0;
      }
      RVar2 = ra_alloc1(as,ref,~(1 << (dest & 0x1f)) & 0xbfef);
      uVar3 = (ir->field_1).t.irt & 0x1f;
      i = ~uVar3 << 0xf;
      if ((0x605fd9U >> uVar3 & 1) == 0) {
        emit_movmroi(as,dest,4,i);
      }
      else {
        pMVar1 = as->mcp;
        *(int *)(pMVar1 + -4) = i;
        as->mcp = pMVar1 + -4;
        emit_rmro(as,XO_ARITHi,1,dest,4);
      }
      uVar3._0_2_ = *(IROpT *)((long)ir + 4);
      uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar2 = -(uint)((0x605fd9U >> (uVar3 & 0x1f) & 1) != 0) & 0x80200 | RVar2;
      xo = XO_MOVto;
    }
    emit_rmro(as,xo,RVar2,dest,0);
  }
LAB_0013f0e0:
  emit_loadu64(as,dest,(uint64_t)(as->J[-1].penalty + 0x33));
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref, MSize mode)
{
  if ((mode & IRTMPREF_IN1)) {
    IRIns *ir = IR(ref);
    if (irt_isnum(ir->t)) {
      if (irref_isk(ref) && !(mode & IRTMPREF_OUT1)) {
	/* Use the number constant itself as a TValue. */
	emit_loada(as, dest, ir_knum(ir));
	return;
      }
      emit_rmro(as, XO_MOVSDto, ra_alloc1(as, ref, RSET_FPR), dest, 0);
    } else {
#if LJ_GC64
      if (irref_isk(ref)) {
	TValue k;
	lj_ir_kvalue(as->J->L, &k, ir);
	emit_movmroi(as, dest, 4, k.u32.hi);
	emit_movmroi(as, dest, 0, k.u32.lo);
      } else {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	if (irt_is64(ir->t)) {
	  emit_u32(as, irt_toitype(ir->t) << 15);
	  emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
	} else {
	  emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
	}
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      }
#else
      if (!irref_isk(ref)) {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      } else if (!irt_ispri(ir->t)) {
	emit_movmroi(as, dest, 0, ir->i);
      }
      if (!(LJ_64 && irt_islightud(ir->t)))
	emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    }
  }
  emit_loada(as, dest, &J2G(as->J)->tmptv); /* g->tmptv holds the TValue(s). */
}